

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineLevel0(SortSubtask *pTask,int nPMA,i64 *piOffset,MergeEngine **ppOut)

{
  PmaReader *pReadr_00;
  PmaReader *pReadr;
  i64 nDummy;
  int rc;
  int i;
  i64 iOff;
  MergeEngine *pNew;
  MergeEngine **ppOut_local;
  i64 *piOffset_local;
  SortSubtask *pSStack_10;
  int nPMA_local;
  SortSubtask *pTask_local;
  
  _rc = (MergeEngine *)*piOffset;
  nDummy._0_4_ = 0;
  pNew = (MergeEngine *)ppOut;
  ppOut_local = (MergeEngine **)piOffset;
  piOffset_local._4_4_ = nPMA;
  pSStack_10 = pTask;
  iOff = (i64)vdbeMergeEngineNew(nPMA);
  *(i64 *)pNew = iOff;
  if ((MergeEngine *)iOff == (MergeEngine *)0x0) {
    nDummy._0_4_ = 7;
  }
  for (nDummy._4_4_ = 0; nDummy._4_4_ < piOffset_local._4_4_ && (int)nDummy == 0;
      nDummy._4_4_ = nDummy._4_4_ + 1) {
    pReadr = (PmaReader *)0x0;
    pReadr_00 = (PmaReader *)(*(long *)(iOff + 0x18) + (long)nDummy._4_4_ * 0x50);
    nDummy._0_4_ = vdbePmaReaderInit(pSStack_10,&pSStack_10->file,(i64)_rc,pReadr_00,(i64 *)&pReadr)
    ;
    _rc = (MergeEngine *)pReadr_00->iEof;
  }
  if ((int)nDummy != 0) {
    vdbeMergeEngineFree((MergeEngine *)iOff);
    *(undefined8 *)pNew = 0;
  }
  *ppOut_local = _rc;
  return (int)nDummy;
}

Assistant:

static int vdbeMergeEngineLevel0(
  SortSubtask *pTask,             /* Sorter task to read from */
  int nPMA,                       /* Number of PMAs to read */
  i64 *piOffset,                  /* IN/OUT: Readr offset in pTask->file */
  MergeEngine **ppOut             /* OUT: New merge-engine */
){
  MergeEngine *pNew;              /* Merge engine to return */
  i64 iOff = *piOffset;
  int i;
  int rc = SQLITE_OK;

  *ppOut = pNew = vdbeMergeEngineNew(nPMA);
  if( pNew==0 ) rc = SQLITE_NOMEM_BKPT;

  for(i=0; i<nPMA && rc==SQLITE_OK; i++){
    i64 nDummy = 0;
    PmaReader *pReadr = &pNew->aReadr[i];
    rc = vdbePmaReaderInit(pTask, &pTask->file, iOff, pReadr, &nDummy);
    iOff = pReadr->iEof;
  }

  if( rc!=SQLITE_OK ){
    vdbeMergeEngineFree(pNew);
    *ppOut = 0;
  }
  *piOffset = iOff;
  return rc;
}